

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O1

lzma_ret lzma_properties_encode(lzma_filter *filter,uint8_t *props)

{
  lzma_ret lVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (*(lzma_vli *)((long)&encoders[0].id + lVar2) == filter->id) {
      lVar2 = (long)&encoders[0].id + lVar2;
      goto LAB_005bdb25;
    }
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0x1f8);
  lVar2 = 0;
LAB_005bdb25:
  if (lVar2 == 0) {
    return LZMA_PROG_ERROR;
  }
  if (*(code **)(lVar2 + 0x30) != (code *)0x0) {
    lVar1 = (**(code **)(lVar2 + 0x30))(filter->options);
    return lVar1;
  }
  return LZMA_OK;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_properties_encode(const lzma_filter *filter, uint8_t *props)
{
	const lzma_filter_encoder *const fe = encoder_find(filter->id);
	if (fe == NULL)
		return LZMA_PROG_ERROR;

	if (fe->props_encode == NULL)
		return LZMA_OK;

	return fe->props_encode(filter->options, props);
}